

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcArithmeticCodec.cpp
# Opt level: O2

void __thiscall o3dgc::Arithmetic_Codec::put_bit(Arithmetic_Codec *this,uint bit)

{
  uint *puVar1;
  uint uVar2;
  uint uVar3;
  
  uVar3 = this->length >> 1;
  this->length = uVar3;
  if (bit != 0) {
    puVar1 = &this->base;
    uVar2 = *puVar1;
    *puVar1 = *puVar1 + uVar3;
    if (CARRY4(uVar2,uVar3)) {
      propagate_carry(this);
      uVar3 = this->length;
    }
  }
  if (uVar3 < 0x1000000) {
    renorm_enc_interval(this);
    return;
  }
  return;
}

Assistant:

void Arithmetic_Codec::put_bit(unsigned bit)
    {
    #ifdef _DEBUG
      if (mode != 1) AC_Error("encoder not initialized");
    #endif

      length >>= 1;                                              // halve interval
      if (bit) {
        unsigned init_base = base;
        base += length;                                               // move base
        if (init_base > base) propagate_carry();               // overflow = carry
      }

      if (length < AC__MinLength) renorm_enc_interval();        // renormalization
    }